

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_splice_node_Test::TestBody(IntrusiveListTest_splice_node_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  vector<int,_std::allocator<int>_> local_310;
  allocator<int> local_2f1;
  int local_2f0 [6];
  iterator local_2d8;
  size_type local_2d0;
  vector<int,_std::allocator<int>_> local_2c8;
  iterator local_2b0;
  iterator local_2a0;
  iterator local_290;
  allocator<int> local_27d;
  int local_27c;
  iterator local_278;
  size_type local_270;
  vector<int,_std::allocator<int>_> local_268;
  undefined1 local_250 [8];
  TestObjectList list4;
  int local_230 [2];
  iterator local_228;
  size_type local_220;
  vector<int,_std::allocator<int>_> local_218;
  allocator<int> local_1fd;
  int local_1fc [5];
  iterator local_1e8;
  size_type local_1e0;
  vector<int,_std::allocator<int>_> local_1d8;
  iterator local_1c0;
  iterator local_1b0;
  iterator local_1a0;
  allocator<int> local_18d;
  int local_18c [3];
  iterator local_180;
  size_type local_178;
  vector<int,_std::allocator<int>_> local_170;
  undefined1 local_158 [8];
  TestObjectList list3;
  vector<int,_std::allocator<int>_> local_128;
  allocator<int> local_109;
  int local_108 [4];
  iterator local_f8;
  size_type local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  iterator local_d0;
  iterator local_c0;
  allocator<int> local_a9;
  int local_a8 [2];
  iterator local_a0;
  size_type local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  TestObjectList list2;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list1;
  IntrusiveListTest_splice_node_Test *this_local;
  
  list2.size_._4_4_ = 1;
  list1.size_ = (size_t)this;
  std::allocator<int>::allocator((allocator<int> *)((long)&list2.size_ + 3));
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)((long)&list2.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,__l_07,(allocator_type *)((long)&list2.size_ + 3));
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list2.size_ + 3));
  local_a8[0] = 100;
  local_a8[1] = 200;
  local_a0 = local_a8;
  local_98 = 2;
  std::allocator<int>::allocator(&local_a9);
  __l_06._M_len = local_98;
  __l_06._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_90,__l_06,&local_a9);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_78,&this->super_IntrusiveListTest,&local_90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  std::allocator<int>::~allocator(&local_a9);
  local_c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_c0.list_,
             (__off64_t *)local_c0.node_,(int)local_78,(__off64_t *)local_d0.list_,
             (size_t)local_d0.node_,(uint)this);
  local_108[0] = 100;
  local_108[1] = 1;
  local_108[2] = 2;
  local_108[3] = 3;
  local_f8 = local_108;
  local_f0 = 4;
  std::allocator<int>::allocator(&local_109);
  __l_05._M_len = local_f0;
  __l_05._M_array = local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_05,&local_109);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_e8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_e8);
  std::allocator<int>::~allocator(&local_109);
  list3.size_._4_4_ = 200;
  std::allocator<int>::allocator((allocator<int> *)((long)&list3.size_ + 3));
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)((long)&list3.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_128,__l_04,(allocator_type *)((long)&list3.size_ + 3));
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_78,&local_128);
  std::vector<int,_std::allocator<int>_>::~vector(&local_128);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list3.size_ + 3));
  local_18c[0] = 500;
  local_18c[1] = 600;
  local_18c[2] = 700;
  local_180 = local_18c;
  local_178 = 3;
  std::allocator<int>::allocator(&local_18d);
  __l_03._M_len = local_178;
  __l_03._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_03,&local_18d);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_158,&this->super_IntrusiveListTest,&local_170);
  std::vector<int,_std::allocator<int>_>::~vector(&local_170);
  std::allocator<int>::~allocator(&local_18d);
  local_1a0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_1c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_158);
  local_1b0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_1c0,2);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_1a0.list_,
             (__off64_t *)local_1a0.node_,(int)local_158,(__off64_t *)local_1b0.list_,
             (size_t)local_1b0.node_,(uint)this);
  local_1fc[0] = 100;
  local_1fc[1] = 1;
  local_1fc[2] = 2;
  local_1fc[3] = 3;
  local_1fc[4] = 700;
  local_1e8 = local_1fc;
  local_1e0 = 5;
  std::allocator<int>::allocator(&local_1fd);
  __l_02._M_len = local_1e0;
  __l_02._M_array = local_1e8;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d8,__l_02,&local_1fd);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_1d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1d8);
  std::allocator<int>::~allocator(&local_1fd);
  local_230[0] = 500;
  local_230[1] = 600;
  local_228 = local_230;
  local_220 = 2;
  std::allocator<int>::allocator((allocator<int> *)((long)&list4.size_ + 7));
  __l_01._M_len = local_220;
  __l_01._M_array = local_228;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_218,__l_01,(allocator_type *)((long)&list4.size_ + 7));
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_158,&local_218);
  std::vector<int,_std::allocator<int>_>::~vector(&local_218);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list4.size_ + 7));
  local_27c = 400;
  local_278 = &local_27c;
  local_270 = 1;
  std::allocator<int>::allocator(&local_27d);
  __l_00._M_len = local_270;
  __l_00._M_array = local_278;
  std::vector<int,_std::allocator<int>_>::vector(&local_268,__l_00,&local_27d);
  anon_unknown.dwarf_4f553::IntrusiveListTest::NewList
            ((TestObjectList *)local_250,&this->super_IntrusiveListTest,&local_268);
  std::vector<int,_std::allocator<int>_>::~vector(&local_268);
  std::allocator<int>::~allocator(&local_27d);
  local_2a0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_290 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_2a0,3);
  local_2b0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_250);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,(int)local_290.list_,
             (__off64_t *)local_290.node_,(int)local_250,(__off64_t *)local_2b0.list_,
             (size_t)local_2b0.node_,(uint)this);
  local_2f0[0] = 100;
  local_2f0[1] = 1;
  local_2f0[2] = 2;
  local_2f0[3] = 400;
  local_2f0[4] = 3;
  local_2f0[5] = 700;
  local_2d8 = local_2f0;
  local_2d0 = 6;
  std::allocator<int>::allocator(&local_2f1);
  __l._M_len = local_2d0;
  __l._M_array = local_2d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_2c8,__l,&local_2f1);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_2c8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c8);
  std::allocator<int>::~allocator(&local_2f1);
  memset(&local_310,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_310);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_250,&local_310);
  std::vector<int,_std::allocator<int>_>::~vector(&local_310);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_250);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_158);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_node) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2, list2.begin());
  AssertListEq(list1, {100, 1, 2, 3});
  AssertListEq(list2, {200});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin(), 2));
  AssertListEq(list1, {100, 1, 2, 3, 700});
  AssertListEq(list3, {500, 600});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 3), list4, list4.begin());
  AssertListEq(list1, {100, 1, 2, 400, 3, 700});
  AssertListEq(list4, {});
}